

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

bool __thiscall FIX::Session::validLogonState(Session *this,MsgType *msgType)

{
  bool bVar1;
  string *__lhs;
  
  __lhs = &(msgType->super_StringField).super_FieldBase.m_string;
  bVar1 = std::operator==(__lhs,"A");
  if (((!bVar1) || ((this->m_state).m_sentReset == false)) &&
     ((this->m_state).m_receivedReset == false)) {
    bVar1 = std::operator==(__lhs,"A");
    if ((!bVar1) || ((this->m_state).m_receivedLogon == true)) {
      bVar1 = std::operator!=(__lhs,"A");
      if ((!bVar1) || ((this->m_state).m_receivedLogon == false)) {
        bVar1 = std::operator==(__lhs,"5");
        if ((!bVar1) || ((this->m_state).m_sentLogon == false)) {
          bVar1 = std::operator!=(__lhs,"5");
          if ((!bVar1) || ((this->m_state).m_sentLogout == false)) {
            bVar1 = std::operator==(__lhs,"4");
            if (!bVar1) {
              bVar1 = std::operator==(__lhs,"3");
              return bVar1;
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool Session::validLogonState(const MsgType &msgType) {
  if ((msgType == MsgType_Logon && m_state.sentReset()) || (m_state.receivedReset())) {
    return true;
  }
  if ((msgType == MsgType_Logon && !m_state.receivedLogon()) || (msgType != MsgType_Logon && m_state.receivedLogon())) {
    return true;
  }
  if (msgType == MsgType_Logout && m_state.sentLogon()) {
    return true;
  }
  if (msgType != MsgType_Logout && m_state.sentLogout()) {
    return true;
  }
  if (msgType == MsgType_SequenceReset) {
    return true;
  }
  if (msgType == MsgType_Reject) {
    return true;
  }

  return false;
}